

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx *dctx,ZSTD_dParameter param,int *value)

{
  uint uVar1;
  ZSTD_bufferMode_e ZVar2;
  
  switch(param) {
  case ZSTD_d_experimentalParam1:
    ZVar2 = dctx->format;
    break;
  case ZSTD_d_experimentalParam2:
    ZVar2 = dctx->outBufferMode;
    break;
  case ZSTD_d_experimentalParam3:
    ZVar2 = dctx->forceIgnoreChecksum;
    break;
  case ZSTD_d_experimentalParam4:
    ZVar2 = dctx->refMultipleDDicts;
    break;
  case ZSTD_d_experimentalParam5:
    ZVar2 = dctx->disableHufAsm;
    break;
  default:
    if (param != ZSTD_d_windowLogMax) {
      return 0xffffffffffffffd8;
    }
    uVar1 = (uint)dctx->maxWindowSize;
    if (uVar1 == 0) {
      __assert_fail("val != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                    ,0xab,"unsigned int ZSTD_highbit32(U32)");
    }
    ZVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> ZVar2 == 0; ZVar2 = ZVar2 - ZSTD_bm_stable) {
      }
    }
  }
  *value = ZVar2;
  return 0;
}

Assistant:

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx* dctx, ZSTD_dParameter param, int* value)
{
    switch (param) {
        case ZSTD_d_windowLogMax:
            *value = (int)ZSTD_highbit32((U32)dctx->maxWindowSize);
            return 0;
        case ZSTD_d_format:
            *value = (int)dctx->format;
            return 0;
        case ZSTD_d_stableOutBuffer:
            *value = (int)dctx->outBufferMode;
            return 0;
        case ZSTD_d_forceIgnoreChecksum:
            *value = (int)dctx->forceIgnoreChecksum;
            return 0;
        case ZSTD_d_refMultipleDDicts:
            *value = (int)dctx->refMultipleDDicts;
            return 0;
        case ZSTD_d_disableHuffmanAssembly:
            *value = (int)dctx->disableHufAsm;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported, "");
}